

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetEnumValueInternal
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int value)

{
  int number;
  OneofDescriptor *oneof_descriptor;
  long lVar1;
  uint32 uVar2;
  Type TVar3;
  
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar2 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = *(int *)(field + 0x38);
    TVar3 = FieldDescriptor::type(field);
    ExtensionSet::SetEnum
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),number,
               (FieldType)TVar3,value,field);
    return;
  }
  oneof_descriptor = *(OneofDescriptor **)(field + 0x60);
  if ((oneof_descriptor != (OneofDescriptor *)0x0) &&
     (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
              (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                         *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x40)) >> 4)
                            * -0x55555554 + (this->schema_).oneof_case_offset_)) !=
      *(int *)(field + 0x38))) {
    ClearOneof(this,message,oneof_descriptor);
  }
  uVar2 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2) = value;
  lVar1 = *(long *)(field + 0x60);
  if (lVar1 != 0) {
    *(undefined4 *)
     ((long)&(message->super_MessageLite)._vptr_MessageLite +
     (ulong)(uint)((int)((ulong)(lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x40)) >> 4) *
                   -0x55555554 + (this->schema_).oneof_case_offset_)) =
         *(undefined4 *)(field + 0x38);
    return;
  }
  SetBit(this,message,field);
  return;
}

Assistant:

void GeneratedMessageReflection::SetEnumValueInternal(
    Message* message, const FieldDescriptor* field,
    int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetEnum(field->number(), field->type(),
                                          value, field);
  } else {
    SetField<int>(message, field, value);
  }
}